

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeRet(RACFGBuilder *this,FuncRetNode *funcRet)

{
  byte bVar1;
  long lVar2;
  Error EVar3;
  uint uVar4;
  FuncValue *pFVar5;
  int *piVar6;
  InstId IVar7;
  size_t index;
  Reg src;
  Operand_ local_48;
  RAWorkReg *workReg;
  
  bVar1 = funcRet->field_0x12;
  lVar2 = *(long *)(*(long *)this + 0x98);
  *(undefined8 *)(*(long *)(this + 8) + 0x198) = *(undefined8 *)funcRet;
  piVar6 = (int *)&funcRet->field_0x44;
  index = 0;
  do {
    if (bVar1 == index) {
      return 0;
    }
    pFVar5 = FuncValuePack::operator[]((FuncValuePack *)(lVar2 + 0xc0),index);
    if ((((piVar6[-1] & 7U) == 1) && (*(char *)((long)&pFVar5->_data + 3) == '\x16')) &&
       (*piVar6 - 0x100U < 0xfffffeff)) {
      EVar3 = BaseRAPass::virtIndexAsWorkReg(*(BaseRAPass **)this,*piVar6 - 0x100U,&workReg);
      if (EVar3 != 0) {
        return EVar3;
      }
      src.super_BaseReg.super_Operand.super_Operand_._signature._bits =
           *(uint32_t *)(workReg + 0x20);
      if ((src.super_BaseReg.super_Operand.super_Operand_._signature._bits & 0xf00) != 0x100) {
        return 0x19;
      }
      src.super_BaseReg.super_Operand.super_Operand_._baseId = *(uint32_t *)(workReg + 4);
      src.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
      src.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
      local_48._signature._bits = 2;
      local_48._baseId = 0;
      local_48._data[0] = 0;
      local_48._data[1] = 0;
      uVar4 = (uint)(byte)TypeUtils::_typeData[*(byte *)(*(long *)(workReg + 8) + 0xd)];
      if ((char)pFVar5->_data != '\0') {
        uVar4 = pFVar5->_data;
      }
      if ((char)uVar4 == '+') {
        EVar3 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_48,8,4);
        if (EVar3 != 0) {
          return EVar3;
        }
        local_48._signature._bits._3_1_ = 8;
        IVar7 = 0x1d6;
        if (this[0x292] != (RACFGBuilder)0x0) {
          IVar7 = 0x4c1;
        }
        EVar3 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar7,&local_48,(Operand_ *)&src);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fld
                          (*(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8),
                           (Mem *)&local_48);
      }
      else {
        if ((uVar4 & 0xff) != 0x2a) {
          return 0x19;
        }
        EVar3 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_48,4,4);
        if (EVar3 != 0) {
          return EVar3;
        }
        local_48._signature._bits._3_1_ = 4;
        IVar7 = 0x1d9;
        if (this[0x292] != (RACFGBuilder)0x0) {
          IVar7 = 0x4c5;
        }
        EVar3 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar7,&local_48,(Operand_ *)&src);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fld
                          (*(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8),
                           (Mem *)&local_48);
      }
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    index = index + 1;
    piVar6 = piVar6 + 4;
  } while( true );
}

Assistant:

Error RACFGBuilder::onBeforeRet(FuncRetNode* funcRet) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  cc()->_setCursor(funcRet->prev());

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    const FuncValue& ret = funcDetail.ret(i);

    if (!op.isReg())
      continue;

    if (ret.regType() == RegType::kX86_St) {
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        if (workReg->group() != RegGroup::kVec)
          return DebugUtils::errored(kErrorInvalidAssignment);

        Reg src(workReg->signature(), workReg->virtId());
        Mem mem;

        TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
        if (ret.hasTypeId())
          typeId = ret.typeId();

        switch (typeId) {
          case TypeId::kFloat32:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
            mem.setSize(4);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          case TypeId::kFloat64:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
            mem.setSize(8);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          default:
            return DebugUtils::errored(kErrorInvalidAssignment);
        }
      }
    }
  }

  return kErrorOk;
}